

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O0

void next_line(fe_state *s)

{
  fe_state *s_local;
  
  if (s->size < 1) {
    s->error = true;
  }
  else if (*s->data == '\n') {
    s->data = s->data + 1;
    s->size = s->size + -1;
  }
  else {
    if (*s->data == '\r') {
      s->data = s->data + 1;
      s->size = s->size + -1;
      if (s->size < 1) {
        s->error = true;
        return;
      }
      if (*s->data == '\n') {
        s->data = s->data + 1;
        s->size = s->size + -1;
        return;
      }
    }
    s->error = true;
  }
  return;
}

Assistant:

static void next_line(fe_state &s)
{
    if (s.size <= 0)
    {
        s.error = true;
        return;
    }
    if (*s.data == '\n')
    {
        s.data++;
        s.size--;
        return;
    }



    if (*s.data == '\r')
    {
        s.data++;
        s.size--;

        if (s.size <= 0)
        {
            s.error = true;
            return;
        }

        if (*s.data == '\n')
        {
            s.data++;
            s.size--;
            return;
        }
    }

    s.error = true;
}